

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::
~BVHNBuilderTwoLevel
          (BVHNBuilderTwoLevel<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive> *this)

{
  ~BVHNBuilderTwoLevel(this);
  ::operator_delete(this);
  return;
}

Assistant:

BVHNBuilderTwoLevel<N,Mesh,Primitive>::~BVHNBuilderTwoLevel () {
    }